

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::RgbaInputFile::FromYca::FromYca
          (FromYca *this,InputPart *inputFile,RgbaChannels rgbaChannels)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  Header *pHVar8;
  Box2i *pBVar9;
  LineOrder *pLVar10;
  Rgba *pRVar11;
  Rgba *pRVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  undefined8 local_30;
  float local_28;
  byte bVar7;
  
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->_inputPart = inputFile;
  this->_readC = (bool)((byte)rgbaChannels >> 5 & 1);
  pHVar8 = InputPart::header(inputFile);
  pBVar9 = Header::dataWindow(pHVar8);
  iVar2 = (pBVar9->min).x;
  iVar3 = (pBVar9->min).y;
  iVar4 = (pBVar9->max).x;
  iVar5 = (pBVar9->max).y;
  this->_xMin = iVar2;
  this->_yMin = iVar3;
  this->_yMax = iVar5;
  this->_width = (iVar4 - iVar2) + 1;
  this->_height = (iVar5 - iVar3) + 1;
  this->_currentScanLine = iVar3 + -0x1d;
  pHVar8 = InputPart::header(this->_inputPart);
  pLVar10 = Header::lineOrder(pHVar8);
  this->_lineOrder = *pLVar10;
  pHVar8 = InputPart::header(this->_inputPart);
  anon_unknown_1::ywFromHeader((anon_unknown_1 *)&local_30,pHVar8);
  (this->_yw).x = (float)(undefined4)local_30;
  (this->_yw).y = (float)local_30._4_4_;
  (this->_yw).z = local_28;
  iVar2 = this->_width;
  lVar14 = (long)iVar2;
  lVar13 = lVar14 * 8;
  bVar6 = 9;
  do {
    bVar7 = bVar6;
    bVar6 = bVar7 + 1;
  } while (1 < lVar13 >> (bVar6 & 0x3f));
  lVar15 = 1L << (bVar7 + 2 & 0x3f);
  lVar1 = lVar15 + -0x40;
  if (SBORROW8(lVar1,lVar13) == lVar1 + lVar14 * -8 < 0) {
    lVar15 = 1L << (bVar6 & 0x3f);
    lVar1 = lVar15 + 0x40;
    if (lVar1 == lVar13 || SBORROW8(lVar1,lVar13) != lVar1 + lVar14 * -8 < 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = lVar15 + lVar14 * -8 + 0x40;
    }
  }
  else {
    uVar16 = lVar15 + lVar14 * -8 + 0x40;
  }
  uVar16 = (uVar16 >> 3) + lVar14;
  lVar13 = 0;
  pRVar11 = (Rgba *)operator_new__(-(ulong)((uVar16 & 0x700000000000000) != 0) | uVar16 * 0x100);
  this->_bufBase = pRVar11;
  pRVar12 = pRVar11;
  do {
    this->_buf1[lVar13] = pRVar12;
    lVar13 = lVar13 + 1;
    pRVar12 = pRVar12 + uVar16;
  } while (lVar13 != 0x1d);
  pRVar11 = pRVar11 + uVar16 * 0x1d;
  lVar13 = 0;
  do {
    this->_buf2[lVar13] = pRVar11;
    lVar13 = lVar13 + 1;
    pRVar11 = pRVar11 + uVar16;
  } while (lVar13 != 3);
  uVar16 = 0xffffffffffffffff;
  if (-0x1b < iVar2) {
    uVar16 = lVar14 * 8 + 0xd0;
  }
  pRVar12 = (Rgba *)operator_new__(uVar16);
  this->_tmpBuf = pRVar12;
  this->_fbBase = (Rgba *)0x0;
  this->_fbXStride = 0;
  this->_fbYStride = 0;
  return;
}

Assistant:

RgbaInputFile::FromYca::FromYca (
    InputPart& inputFile, RgbaChannels rgbaChannels)
    : _inputPart (inputFile)
{
    _readC = (rgbaChannels & WRITE_C) ? true : false;

    const Box2i dw = _inputPart.header ().dataWindow ();

    _xMin            = dw.min.x;
    _yMin            = dw.min.y;
    _yMax            = dw.max.y;
    _width           = dw.max.x - dw.min.x + 1;
    _height          = dw.max.y - dw.min.y + 1;
    _currentScanLine = dw.min.y - N - 2;
    _lineOrder       = _inputPart.header ().lineOrder ();
    _yw              = ywFromHeader (_inputPart.header ());

    ptrdiff_t pad = cachePadding (_width * sizeof (Rgba)) / sizeof (Rgba);

    _bufBase = new Rgba[(_width + pad) * (N + 2 + 3)];

    for (int i = 0; i < N + 2; ++i)
        _buf1[i] = _bufBase + (i * (_width + pad));

    for (int i = 0; i < 3; ++i)
        _buf2[i] = _bufBase + ((i + N + 2) * (_width + pad));

    _tmpBuf = new Rgba[_width + N - 1];

    _fbBase    = 0;
    _fbXStride = 0;
    _fbYStride = 0;
}